

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::Generate(cmMakefile *this,cmLocalGenerator *lg)

{
  cmake *this_00;
  bool bVar1;
  cmValue lhs;
  allocator<char> local_31;
  string local_30;
  
  DoGenerate(this,lg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_BACKWARDS_COMPATIBILITY",&local_31);
  lhs = GetDefinition(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (lhs.Value != (string *)0x0) {
    bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhs.Value,"2.4");
    if (bVar1) {
      this_00 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,
                 "You have set CMAKE_BACKWARDS_COMPATIBILITY to a CMake version less than 2.4. This version of CMake only supports backwards compatibility with CMake 2.4 or later. For compatibility with older versions please use any CMake 2.8.x release or lower."
                 ,&local_31);
      cmake::IssueMessage(this_00,FATAL_ERROR,&local_30,&this->Backtrace);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  return;
}

Assistant:

void cmMakefile::Generate(cmLocalGenerator& lg)
{
  this->DoGenerate(lg);
  cmValue oldValue = this->GetDefinition("CMAKE_BACKWARDS_COMPATIBILITY");
  if (oldValue &&
      cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, *oldValue,
                                    "2.4")) {
    this->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "You have set CMAKE_BACKWARDS_COMPATIBILITY to a CMake version less "
      "than 2.4. This version of CMake only supports backwards compatibility "
      "with CMake 2.4 or later. For compatibility with older versions please "
      "use any CMake 2.8.x release or lower.",
      this->Backtrace);
  }
}